

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::TextureWrapCase::testTexture(TextureWrapCase *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  TexParamVerifier *pTVar2;
  long lVar3;
  
  pTVar2 = (this->super_TextureCase).m_verifier;
  (*pTVar2->_vptr_TexParamVerifier[2])
            (pTVar2,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
             (ulong)this->m_valueName,0x2901);
  lVar3 = 0;
  ApiCase::expectError((ApiCase *)this,0);
  this_00 = &(this->super_TextureCase).super_ApiCase.super_CallLogWrapper;
  do {
    uVar1 = *(uint *)((long)&DAT_01bcbcec + lVar3);
    glu::CallLogWrapper::glTexParameteri
              (this_00,(this->super_TextureCase).m_textureTarget,this->m_valueName,uVar1);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar2 = (this->super_TextureCase).m_verifier;
    (*pTVar2->_vptr_TexParamVerifier[2])
              (pTVar2,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               (ulong)this->m_valueName,(ulong)uVar1);
    ApiCase::expectError((ApiCase *)this,0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  lVar3 = 0;
  do {
    uVar1 = *(uint *)((long)&DAT_01bcbcec + lVar3);
    glu::CallLogWrapper::glTexParameterf
              (this_00,(this->super_TextureCase).m_textureTarget,this->m_valueName,(float)uVar1);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar2 = (this->super_TextureCase).m_verifier;
    (*pTVar2->_vptr_TexParamVerifier[2])
              (pTVar2,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               (ulong)this->m_valueName,(ulong)uVar1);
    ApiCase::expectError((ApiCase *)this,0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  return;
}

Assistant:

void testTexture (void)
	{
		const GLenum wrapValues[] = {GL_CLAMP_TO_EDGE, GL_REPEAT, GL_MIRRORED_REPEAT};

		m_verifier->verifyInteger(m_testCtx, m_textureTarget, m_valueName, GL_REPEAT);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
		{
			glTexParameteri(m_textureTarget, m_valueName, wrapValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, m_valueName, wrapValues[ndx]);
			expectError(GL_NO_ERROR);
		}

		//check unit conversions with float

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(wrapValues); ++ndx)
		{
			glTexParameterf(m_textureTarget, m_valueName, (GLfloat)wrapValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, m_valueName, wrapValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}